

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O0

ANNpointArray annAllocPts(int n,int dim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ANNpointArray ppAVar4;
  void *pvVar5;
  int in_ESI;
  int in_EDI;
  int i;
  ANNpoint p;
  ANNpointArray pa;
  int local_1c;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDI;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppAVar4 = (ANNpointArray)operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(in_EDI * in_ESI);
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar3);
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    ppAVar4[local_1c] = (ANNpoint)((long)pvVar5 + (long)(local_1c * in_ESI) * 8);
  }
  return ppAVar4;
}

Assistant:

ANNpointArray annAllocPts(int n, int dim)  // allocate n pts in dim
{
    ANNpointArray pa = new ANNpoint[n];  // allocate points
    ANNpoint p = new ANNcoord[n * dim];  // allocate space for coords
    for (int i = 0; i < n; i++) {
        pa[i] = &(p[i * dim]);
    }
    return pa;
}